

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> experiment<lcp64_experiment>(lcp64_experiment exp)

{
  unsigned_long *__src;
  unsigned_long uVar1;
  const_iterator __position;
  const_iterator __begin0_1;
  unsigned_long uVar2;
  long lVar3;
  ulong uVar4;
  pointer puVar5;
  const_iterator __begin0;
  const_iterator __end0;
  ulong uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM4 [16];
  pair<unsigned_long,_unsigned_long> pVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> times;
  ulong in_stack_00000018;
  vector<unsigned_long,_std::allocator<unsigned_long>_> res;
  uint64_t timespan;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  value_type_conflict local_38;
  
  uVar10 = 0;
  uVar7 = 0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  do {
    local_38 = 0;
    if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_58,
                 (iterator)
                 local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_38);
    }
    else {
      *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar2 = (*(code *)*res.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_start)
                      (*times.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                       *times.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_00000018 >> 3);
    lVar9 = 1000;
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = uVar2;
    lVar3 = std::chrono::_V2::system_clock::now();
    do {
      DoNotOptimizeAway<lcp64_experiment&>
                ((lcp64_experiment *)
                 &times.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    lVar9 = std::chrono::_V2::system_clock::now();
    local_38 = lVar9 - lVar3;
    uVar4 = (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    __position._M_current =
         local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (0 < (long)uVar4) {
      uVar6 = uVar4 >> 1;
      uVar8 = ~uVar6 + uVar4;
      uVar4 = uVar6;
      if ((__position._M_current + uVar6 + 1)[-1] <= local_38) {
        uVar4 = uVar8;
        __position._M_current = __position._M_current + uVar6 + 1;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              (&local_78,__position,&local_38);
    uVar7 = uVar7 + 1;
    if ((uVar7 & 3) == 0) {
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      __src = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
      if (__src != local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
        memmove(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,__src,
                (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      }
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    }
    uVar4 = (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    if (0x32 < uVar4) {
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        auVar15 = vcvtusi2sd_avx512f(in_XMM4,uVar4);
        dVar11 = auVar15._0_8_;
        dVar14 = 0.0;
      }
      else {
        dVar13 = 0.0;
        puVar5 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          auVar15 = vcvtusi2sd_avx512f(in_XMM4,*puVar5);
          puVar5 = puVar5 + 1;
          dVar13 = dVar13 + auVar15._0_8_;
        } while (puVar5 != local_78.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
        auVar15 = vcvtusi2sd_avx512f(in_XMM4,uVar4);
        dVar11 = auVar15._0_8_;
        auVar15 = ZEXT816(0);
        puVar5 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          auVar12 = vcvtusi2sd_avx512f(in_XMM4,*puVar5);
          puVar5 = puVar5 + 1;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = auVar12._0_8_ - dVar13 / dVar11;
          auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
          dVar14 = auVar15._0_8_;
        } while (puVar5 != local_78.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
      if ((dVar14 / dVar11 < 10.0) ||
         (auVar15 = vcvtusi2sd_avx512f(in_XMM4,uVar10), dVar14 / dVar11 < auVar15._0_8_)) break;
    }
    if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      auVar15 = vcvtusi2sd_avx512f(in_XMM4,uVar4);
      dVar11 = auVar15._0_8_;
      auVar15 = ZEXT816(0);
    }
    else {
      dVar14 = 0.0;
      puVar5 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        auVar15 = vcvtusi2sd_avx512f(in_XMM4,*puVar5);
        puVar5 = puVar5 + 1;
        dVar14 = dVar14 + auVar15._0_8_;
      } while (puVar5 != local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      auVar15 = vcvtusi2sd_avx512f(in_XMM4,uVar4);
      dVar11 = auVar15._0_8_;
      auVar15 = ZEXT816(0);
      puVar5 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        auVar12 = vcvtusi2sd_avx512f(in_XMM4,*puVar5);
        puVar5 = puVar5 + 1;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = auVar12._0_8_ - dVar14 / dVar11;
        auVar15 = vfmadd231sd_fma(auVar15,auVar17,auVar17);
      } while (puVar5 != local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    auVar12._0_8_ = auVar15._0_8_ / dVar11;
    auVar12._8_8_ = auVar15._8_8_;
    uVar10 = vcvttsd2usi_avx512f(auVar12);
  } while (uVar7 != 500);
  uVar2 = *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if ((local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start == (pointer)0x0) ||
     (operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start),
     local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (unsigned_long *)0x0)) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar18.second = uVar1;
  pVar18.first = uVar2;
  return pVar18;
}

Assistant:

std::pair<size_t,size_t> experiment(experiment_type exp) {

    std::vector<uint64_t> times;
    std::vector<uint64_t> res;
    uint64_t prev_deviation = 0;

    for(size_t i = 0; i < MAX_SAMPLES; ++i) {
      res.push_back(0);

      res.back() = exp();

      using time_point = std::chrono::high_resolution_clock::time_point;
      time_point t1 = std::chrono::high_resolution_clock::now();

      for(size_t j = 0; j < MEASUREMENTS; ++j) {
	DoNotOptimizeAway(exp);
      }

      time_point t2 = std::chrono::high_resolution_clock::now();

      const uint64_t timespan = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1).count();

      times.insert(std::upper_bound(times.begin(), times.end(), timespan), timespan);

      if( (i+1) % 4 == 0) {
	times.pop_back();
	times.erase(times.begin());
      }
      if(times.size() > MIN_SAMPLES) {
	double deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
	if(deviation < MIN_DEVIATION) break;
	if(prev_deviation > deviation) break;
      }
      prev_deviation = packed::math::deviation(times, packed::math::arithmetic_mean(times));
    }
    // std::cout << "len " << length << " means " << math::arithmetic_mean(times) << " dev: " << math::deviation(times, math::arithmetic_mean(times)) << "LCE " << res.back() << std::endl;
    return std::make_pair(times[0], times.back());
}